

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void check_and_resend(longlong current_time)

{
  pair<int,_int> __position;
  iterator iVar1;
  _Base_ptr p_Var2;
  mapped_type_conflict *pmVar3;
  _Rb_tree_node_base *p_Var4;
  pair<int,_int> pVar5;
  pair<int,_int> *ppVar6;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_long_long>_>,_std::_Rb_tree_iterator<std::pair<const_int,_long_long>_>_>
  pVar7;
  pair<const_std::pair<int,_int>,_long_long> elem;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> outdates_messages;
  pair<const_int,_long_long> msg;
  pair<int,_int> local_88;
  pair<int,_int> pStack_80;
  pair<int,_int> local_78;
  pair<int,_int> *local_68;
  iterator iStack_60;
  pair<int,_int> *local_58;
  undefined8 local_48;
  _Base_ptr p_Stack_40;
  
  local_68 = (pair<int,_int> *)0x0;
  iStack_60._M_current = (pair<int,_int> *)0x0;
  local_58 = (pair<int,_int> *)0x0;
  ppVar6 = local_68;
  iVar1._M_current = iStack_60._M_current;
  if ((_Rb_tree_header *)MT._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &MT._M_t._M_impl.super__Rb_tree_header) {
    p_Var2 = MT._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_88.first = p_Var2[1]._M_color;
      local_88.second = *(int *)&p_Var2[1].field_0x4;
      pStack_80 = (pair<int,_int>)p_Var2[1]._M_parent;
      if (5000000 < current_time - (long)pStack_80) {
        if (iStack_60._M_current == local_58) {
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
          _M_realloc_insert<std::pair<int,int>const&>
                    ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_68,
                     iStack_60,&local_88);
        }
        else {
          *iStack_60._M_current = local_88;
          iStack_60._M_current = iStack_60._M_current + 1;
        }
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
      ppVar6 = local_68;
      iVar1._M_current = iStack_60._M_current;
    } while ((_Rb_tree_header *)p_Var2 != &MT._M_t._M_impl.super__Rb_tree_header);
  }
  for (; ppVar6 != iVar1._M_current; ppVar6 = ppVar6 + 1) {
    erase_message_from_maps((pair<int,_int>)0x10300f);
  }
  p_Var4 = MM._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)MM._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &MM._M_t._M_impl.super__Rb_tree_header) {
    do {
      local_78 = (pair<int,_int>)p_Var4[1]._M_left;
      local_88.first = p_Var4[1]._M_color;
      local_88.second = *(int *)&p_Var4[1].field_0x4;
      pStack_80 = (pair<int,_int>)p_Var4[1]._M_parent;
      pmVar3 = std::
               map<std::pair<int,_int>,_long_long,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_long_long>_>_>
               ::operator[](&MST,&local_88);
      if (1000000 < current_time - *pmVar3) {
        send_message(local_88.first,local_88.second);
        pmVar3 = std::
                 map<std::pair<int,_int>,_long_long,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_long_long>_>_>
                 ::operator[](&MST,&local_88);
        *pmVar3 = current_time;
      }
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != &MM._M_t._M_impl.super__Rb_tree_header);
  }
  if ((_Rb_tree_header *)received_messages._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &received_messages._M_t._M_impl.super__Rb_tree_header) {
    p_Var2 = received_messages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_88.first = 0;
      local_88.second = 0;
      pStack_80.first = 0;
      pStack_80.second = 0;
      local_78.first = 0;
      local_78.second = 0;
      p_Var4 = *(_Rb_tree_node_base **)(p_Var2 + 2);
      pVar5 = local_88;
      __position = pStack_80;
      while (local_88 = pVar5, pStack_80 = __position,
            p_Var4 != (_Rb_tree_node_base *)&p_Var2[1]._M_left) {
        local_48 = *(undefined8 *)(p_Var4 + 1);
        p_Stack_40 = p_Var4[1]._M_parent;
        if (5000000 < current_time - (long)p_Stack_40) {
          if (__position == local_78) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_88,(iterator)__position,
                       (int *)&local_48);
          }
          else {
            *(int *)__position = (int)local_48;
            pStack_80 = (pair<int,_int>)((long)__position + 4);
          }
        }
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
        pVar5 = local_88;
        __position = pStack_80;
      }
      if (pVar5 != __position) {
        do {
          local_48 = CONCAT44(local_48._4_4_,*(int *)pVar5);
          pVar7 = std::
                  _Rb_tree<int,_std::pair<const_int,_long_long>,_std::_Select1st<std::pair<const_int,_long_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_long_long>_>_>
                  ::equal_range((_Rb_tree<int,_std::pair<const_int,_long_long>,_std::_Select1st<std::pair<const_int,_long_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_long_long>_>_>
                                 *)&p_Var2[1]._M_parent,(key_type *)&local_48);
          std::
          _Rb_tree<int,_std::pair<const_int,_long_long>,_std::_Select1st<std::pair<const_int,_long_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_long_long>_>_>
          ::_M_erase_aux((_Rb_tree<int,_std::pair<const_int,_long_long>,_std::_Select1st<std::pair<const_int,_long_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_long_long>_>_>
                          *)&p_Var2[1]._M_parent,(_Base_ptr)pVar7.first._M_node,
                         (_Base_ptr)pVar7.second._M_node);
          pVar5 = (pair<int,_int>)((long)pVar5 + 4);
        } while (pVar5 != __position);
      }
      if (local_88 != (pair<int,_int>)0x0) {
        operator_delete((void *)local_88);
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != &received_messages._M_t._M_impl.super__Rb_tree_header);
  }
  if (local_68 != (pair<int,_int> *)0x0) {
    operator_delete(local_68);
  }
  return;
}

Assistant:

void check_and_resend(long long current_time) {
    std::vector<std::pair<int, int>> outdates_messages;
    for (auto elem : MT) {
        long long diff = current_time - elem.second;
        if (diff > TIME_TO_KEEP) {
            outdates_messages.push_back(elem.first);
        }
    }

    for (auto key : outdates_messages) {
        erase_message_from_maps(key);
    }

    for (auto elem : MM) {
        long long diff = current_time - MST[elem.first];
        if (diff > SENDING_INTERVAL) {
            int id_destination = elem.first.first;
            int id_message = elem.first.second;
            send_message(id_destination, id_message);
            MST[elem.first] = current_time;
        }
    }

    for (auto it = received_messages.begin(); it != received_messages.end(); ++it) {
        std::vector<int> outdates_received_kept;
        for (auto msg : it->second) {
            long long diff = current_time - msg.second;
            if (diff > TIME_KEEP_RECEIVED) {
                outdates_received_kept.push_back(msg.first);
            }
        }
        for (auto id : outdates_received_kept) {
            it->second.erase(id);
        }
    }
}